

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O3

Variable * __thiscall
soul::HEARTGenerator::createVariableDeclaration
          (HEARTGenerator *this,VariableDeclaration *v,Role role,bool canBeReference)

{
  vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_> *__x;
  Module *pMVar1;
  string *psVar2;
  Expression *e;
  unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  __p;
  Variable *pVVar3;
  Expression *pEVar4;
  undefined7 in_register_00000009;
  string_view newString;
  Type t;
  Role local_7c;
  Annotation local_78;
  Identifier local_48;
  undefined1 local_40 [16];
  StructurePtr local_30;
  
  pMVar1 = this->module;
  local_7c = role;
  if ((int)CONCAT71(in_register_00000009,canBeReference) == 0) {
    AST::VariableDeclaration::getType((Type *)local_40,v);
    local_78.dictionary.super_StringDictionary._vptr_StringDictionary = (_func_int **)local_40._8_8_
    ;
    local_78.dictionary.strings.
    super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_30.object;
    if (local_30.object != (Structure *)0x0) {
      ((local_30.object)->super_RefCountedObject).refCount =
           ((local_30.object)->super_RefCountedObject).refCount + 1;
    }
    local_78.properties._M_t.
    super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
    .
    super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
    ._M_head_impl._3_5_ = SUB85(local_40._0_8_,3);
    local_78.properties._M_t.
    super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
    .
    super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
    ._M_head_impl._0_3_ = (uint3)(ushort)local_40._0_8_;
  }
  else {
    AST::VariableDeclaration::getType((Type *)&local_78,v);
  }
  psVar2 = (v->name).name;
  if (psVar2 == (string *)0x0) {
    local_48.name = (string *)0x0;
  }
  else {
    newString._M_str = (psVar2->_M_dataplus)._M_p;
    newString._M_len = psVar2->_M_string_length;
    local_48 = Identifier::Pool::get(&this->module->allocator->identifiers,newString);
  }
  pVVar3 = PoolAllocator::
           allocate<soul::heart::Variable,soul::CodeLocation&,soul::Type,soul::Identifier,soul::heart::Variable::Role&>
                     (&pMVar1->allocator->pool,
                      &(v->super_Statement).super_ASTObject.context.location,(Type *)&local_78,
                      &local_48,&local_7c);
  RefCountedPtr<soul::Structure>::decIfNotNull
            ((Structure *)
             local_78.dictionary.strings.
             super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (!canBeReference) {
    RefCountedPtr<soul::Structure>::decIfNotNull(local_30.object);
  }
  (v->generatedVariable).object = pVVar3;
  if ((local_7c == state) && (e = (v->initialValue).object, e != (Expression *)0x0)) {
    pEVar4 = evaluateAsConstantExpression(this,e);
    (pVVar3->initialValue).object = pEVar4;
  }
  AST::Annotation::toPlainAnnotation
            (&local_78,&v->annotation,&((this->module->program).pimpl)->stringDictionary);
  __p._M_t.
  super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  .
  super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
  ._M_head_impl =
       local_78.properties._M_t.
       super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
       .
       super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
       ._M_head_impl;
  local_78.properties._M_t.
  super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  .
  super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
           *)&pVVar3->annotation,
          (pointer)__p._M_t.
                   super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
                   ._M_head_impl);
  __x = &local_78.dictionary.strings;
  std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::
  operator=(&(pVVar3->annotation).dictionary.strings,__x);
  (pVVar3->annotation).dictionary.nextIndex = local_78.dictionary.nextIndex;
  local_78.dictionary.super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__StringDictionary_002ca250;
  std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::~vector
            (__x);
  std::
  unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  ::~unique_ptr(&local_78.properties);
  return pVVar3;
}

Assistant:

heart::Variable& createVariableDeclaration (AST::VariableDeclaration& v,
                                                heart::Variable::Role role,
                                                bool canBeReference)
    {
        auto& av = module.allocate<heart::Variable> (v.context.location,
                                                     canBeReference ? v.getType() : v.getType().removeReferenceIfPresent(),
                                                     convertIdentifier (v.name), role);
        v.generatedVariable = av;

        if (role == heart::Variable::Role::state && v.initialValue != nullptr)
            av.initialValue = evaluateAsConstantExpression (*v.initialValue);

        av.annotation = v.annotation.toPlainAnnotation (module.program.getStringDictionary());
        return av;
    }